

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O3

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeF64x2Const
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,array<double,_2UL> *vals)

{
  Result<wasm::Ok> *pRVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  Literal *this_00;
  _Variant_storage<false,_wasm::Ok,_wasm::Err> local_d0;
  undefined1 auStack_a8 [8];
  array<wasm::Literal,_2UL> lanes;
  anon_union_16_6_1532cd5a_for_Literal_0 local_70;
  undefined8 local_60;
  Literal local_58;
  Result<wasm::Ok> *local_40;
  Index local_34;
  
  lanes._M_elems[1].field_0.i64 = 0;
  lanes._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  lanes._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  lanes._M_elems[0].type.id = 0;
  auStack_a8 = (undefined1  [8])0x0;
  lanes._M_elems[0].field_0.i64 = 0;
  lVar3 = 0;
  this_00 = (Literal *)auStack_a8;
  bVar2 = true;
  local_40 = __return_storage_ptr__;
  local_34 = pos;
  do {
    bVar4 = bVar2;
    local_70.i64 = (int64_t)vals->_M_elems[lVar3];
    local_60 = 5;
    Literal::operator=(this_00,(Literal *)&local_70.func);
    Literal::~Literal((Literal *)&local_70.func);
    lVar3 = 1;
    this_00 = (Literal *)&lanes._M_elems[0].type;
    bVar2 = false;
  } while (bVar4);
  Literal::Literal(&local_58,(LaneArray<2> *)auStack_a8);
  IRBuilder::makeConst((Result<wasm::Ok> *)&local_d0,&this->irBuilder,&local_58);
  pRVar1 = local_40;
  withLoc<wasm::Ok>(local_40,this,local_34,(Result<wasm::Ok> *)&local_d0);
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            (&local_d0);
  Literal::~Literal(&local_58);
  lVar3 = 0x18;
  do {
    Literal::~Literal((Literal *)((long)lanes._M_elems + lVar3 + -8));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return pRVar1;
}

Assistant:

Result<> makeF64x2Const(Index pos,
                          const std::vector<Annotation>& annotations,
                          const std::array<double, 2>& vals) {
    std::array<Literal, 2> lanes;
    for (size_t i = 0; i < 2; ++i) {
      lanes[i] = Literal(vals[i]);
    }
    return withLoc(pos, irBuilder.makeConst(Literal(lanes)));
  }